

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void qcc_list_push_back(qcc_list *list,qcc_list_node *node)

{
  qcc_list *pqVar1;
  
  pqVar1 = (qcc_list *)list->last;
  if ((qcc_list *)list->last == (qcc_list *)0x0) {
    pqVar1 = list;
  }
  pqVar1->first = node;
  node->next = (qcc_list_node *)0x0;
  list->last = node;
  return;
}

Assistant:

void qcc_list_push_back(struct qcc_list *list, struct qcc_list_node *node)
{
    if (list->last)
        list->last->next = node;
    else
        list->first = node;

    node->next = 0;
    list->last = node;
}